

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4c4150::InlineImageTracker::~InlineImageTracker(InlineImageTracker *this)

{
  (this->super_TokenFilter)._vptr_TokenFilter = (_func_int **)&PTR__InlineImageTracker_002afef8;
  std::__cxx11::string::~string((string *)&this->bi_str);
  std::__cxx11::string::~string((string *)&this->dict_str);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->resources).super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

~InlineImageTracker() override = default;